

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O2

Am_Wrapper * value_from_cycle_command_proc(Am_Object *param_1)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Wrapper *pAVar3;
  Am_String s;
  Am_Value v;
  Am_Value valv;
  
  valv.type = 0;
  valv.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get(0x8688,0x169);
  Am_Value::operator=(&valv,pAVar1);
  s.data = (Am_String_Data *)0x0;
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get(0x8688,0x150);
  Am_Value::operator=(&v,pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"New value for command ");
  poVar2 = (ostream *)operator<<(poVar2,&cy_cmd);
  poVar2 = std::operator<<(poVar2," is ");
  poVar2 = (ostream *)operator<<(poVar2,&valv);
  poVar2 = std::operator<<(poVar2," label is ");
  poVar2 = (ostream *)operator<<(poVar2,&v);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  if (v.type == 0x8008) {
    Am_String::operator=(&s,&v);
  }
  else {
    Am_String::operator=(&s,"NOT TEXT");
  }
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&s);
  Am_Value::~Am_Value(&v);
  Am_String::~Am_String(&s);
  Am_Value::~Am_Value(&valv);
  return pAVar3;
}

Assistant:

Am_Define_No_Self_Formula(bool, on_left_form)
{
  Am_Value value;
  // get the value from the checkbox widget's value.
  value = checkboxes.Peek(Am_VALUE);
  return !find_in_list(value, ON_RIGHT);
}